

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderMaxInvocationsTest::initTest(GeometryShaderMaxInvocationsTest *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  long *local_1c0 [2];
  long local_1b0 [2];
  stringstream stream;
  undefined1 local_190 [112];
  ios_base local_120 [264];
  long lVar6;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0xa15);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_INVOCATIONS,
             &this->m_max_geometry_shader_invocations);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() call failed for GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa1d);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ostream::operator<<(local_190,this->m_max_geometry_shader_invocations);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&this->m_max_geometry_shader_invocations_string,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  this->m_geometry_shader_parts_for_multiple_invocations_pass[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\n#define GEOMETRY_SHADER_INVOCATIONS "
  ;
  pcVar1 = (this->m_max_geometry_shader_invocations_string)._M_dataplus._M_p;
  this->m_geometry_shader_parts_for_multiple_invocations_pass[1] = pcVar1;
  this->m_geometry_shader_parts_for_multiple_invocations_pass[2] =
       "u\n\nlayout(points) in;\nlayout(triangle_strip, max_vertices = 3) out;\n";
  this->m_geometry_shader_parts_for_multiple_invocations_pass[3] =
       "layout(invocations = GEOMETRY_SHADER_INVOCATIONS) in;\n";
  this->m_geometry_shader_parts_for_multiple_invocations_pass[4] =
       "\nvoid main()\n{\n    float dx = (2.0 / float(GEOMETRY_SHADER_INVOCATIONS));\n    \n    gl_Position = vec4(-1.0 + (dx * float(gl_InvocationID)),      -1.001, 0.0, 1.0);\n    EmitVertex();\n    \n    gl_Position = vec4(-1.0 + (dx * float(gl_InvocationID)),       1.001, 0.0, 1.0);\n    EmitVertex();\n    \n    gl_Position = vec4(-1.0 + (dx * float(gl_InvocationID + 1)),   1.001, 0.0, 1.0);\n    EmitVertex();\n}\n"
  ;
  this->m_geometry_shader_parts_for_single_invocation_pass[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\n#define GEOMETRY_SHADER_INVOCATIONS "
  ;
  this->m_geometry_shader_parts_for_single_invocation_pass[1] = pcVar1;
  this->m_geometry_shader_parts_for_single_invocation_pass[2] =
       "u\n\nlayout(points) in;\nlayout(triangle_strip, max_vertices = 3) out;\n";
  this->m_geometry_shader_parts_for_single_invocation_pass[3] =
       "\nvoid main()\n{\n    float dx = (2.0 / float(GEOMETRY_SHADER_INVOCATIONS));\n    \n    gl_Position = vec4(-1.0 + (dx * float(gl_InvocationID)),      -1.001, 0.0, 1.0);\n    EmitVertex();\n    \n    gl_Position = vec4(-1.0 + (dx * float(gl_InvocationID)),       1.001, 0.0, 1.0);\n    EmitVertex();\n    \n    gl_Position = vec4(-1.0 + (dx * float(gl_InvocationID + 1)),   1.001, 0.0, 1.0);\n    EmitVertex();\n}\n"
  ;
  GVar5 = (**(code **)(lVar6 + 0x3c8))();
  this->m_program_object_id_for_multiple_invocations_pass = GVar5;
  GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fragment_shader_id_for_multiple_invocations_pass = GVar5;
  GVar5 = (**(code **)(lVar6 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_id_for_multiple_invocations_pass = GVar5;
  GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vertex_shader_id_for_multiple_invocations_pass = GVar5;
  GVar5 = (**(code **)(lVar6 + 0x3c8))();
  this->m_program_object_id_for_single_invocation_pass = GVar5;
  GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fragment_shader_id_for_single_invocation_pass = GVar5;
  GVar5 = (**(code **)(lVar6 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_id_for_single_invocation_pass = GVar5;
  GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vertex_shader_id_for_single_invocation_pass = GVar5;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Failed to create program or shader objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xa43);
  bVar2 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,
                     this->m_program_object_id_for_multiple_invocations_pass,
                     this->m_fragment_shader_id_for_multiple_invocations_pass,1,
                     &m_fragment_shader_code,
                     this->m_geometry_shader_id_for_multiple_invocations_pass,5,
                     this->m_geometry_shader_parts_for_multiple_invocations_pass,
                     this->m_vertex_shader_id_for_multiple_invocations_pass,1,&m_vertex_shader_code,
                     (bool *)0x0);
  if (bVar2) {
    bVar2 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,
                       this->m_program_object_id_for_single_invocation_pass,
                       this->m_fragment_shader_id_for_single_invocation_pass,1,
                       &m_fragment_shader_code,this->m_geometry_shader_id_for_single_invocation_pass
                       ,4,this->m_geometry_shader_parts_for_single_invocation_pass,
                       this->m_vertex_shader_id_for_single_invocation_pass,1,&m_vertex_shader_code,
                       (bool *)0x0);
    if (bVar2) {
      (**(code **)(lVar6 + 0x6f8))(1,&this->m_color_texture_id);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"Could not create texture object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0xa5d);
      (**(code **)(lVar6 + 0x6d0))(1,&this->m_framebuffer_object_id);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"Could not create framebuffer object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0xa60);
      GVar5 = this->m_max_geometry_shader_invocations * 9;
      this->m_texture_width = GVar5;
      bVar2 = TestCaseBase::setupFramebufferWithTextureAsAttachment
                        (&this->super_TestCaseBase,this->m_framebuffer_object_id,
                         this->m_color_texture_id,0x8058,GVar5,9);
      if (bVar2) {
        (**(code **)(lVar6 + 0x708))(1,&this->m_vertex_array_object_id);
        (**(code **)(lVar6 + 0xd8))(this->m_vertex_array_object_id);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"Could not create vertex array object",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                        ,0xa6e);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
        std::ios_base::~ios_base(local_120);
        return;
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Failed to setup framebuffer",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                 ,0xa67);
    }
    else {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Could not create program from valid vertex/geometry/fragment shader",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                 ,0xa58);
    }
  }
  else {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Could not create program from valid vertex/geometry/fragment shader",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0xa4d);
  }
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderMaxInvocationsTest::initTest()
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_INVOCATIONS, &m_max_geometry_shader_invocations);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT");

	/* Prepare string for GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT */
	std::stringstream stream;
	stream << m_max_geometry_shader_invocations;
	m_max_geometry_shader_invocations_string = stream.str();

	/* Prepare gemetry shader parts for multiple invocations pass */
	const glw::GLuint n_geometry_shader_parts_for_multiple_invocations_pass = 5;

	m_geometry_shader_parts_for_multiple_invocations_pass[0] = m_geometry_shader_code_preamble;
	m_geometry_shader_parts_for_multiple_invocations_pass[1] = m_max_geometry_shader_invocations_string.c_str();
	m_geometry_shader_parts_for_multiple_invocations_pass[2] = m_geometry_shader_code_layout;
	m_geometry_shader_parts_for_multiple_invocations_pass[3] = m_geometry_shader_code_layout_invocations;
	m_geometry_shader_parts_for_multiple_invocations_pass[4] = m_geometry_shader_code_body;

	/* Prepare gemetry shader parts for single invocation pass */
	const glw::GLuint n_geometry_shader_parts_for_single_invocation_pass = 4;

	m_geometry_shader_parts_for_single_invocation_pass[0] = m_geometry_shader_code_preamble;
	m_geometry_shader_parts_for_single_invocation_pass[1] = m_max_geometry_shader_invocations_string.c_str();
	m_geometry_shader_parts_for_single_invocation_pass[2] = m_geometry_shader_code_layout;
	m_geometry_shader_parts_for_single_invocation_pass[3] = m_geometry_shader_code_body;

	/* Create program and shaders for multiple GS invocations */
	m_program_object_id_for_multiple_invocations_pass = gl.createProgram();

	m_fragment_shader_id_for_multiple_invocations_pass = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id_for_multiple_invocations_pass = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id_for_multiple_invocations_pass   = gl.createShader(GL_VERTEX_SHADER);

	/* Create program and shaders for single GS invocations */
	m_program_object_id_for_single_invocation_pass = gl.createProgram();

	m_fragment_shader_id_for_single_invocation_pass = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id_for_single_invocation_pass = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id_for_single_invocation_pass   = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create program or shader objects");

	/* Build program for multiple GS invocations */
	if (false == buildProgram(m_program_object_id_for_multiple_invocations_pass,
							  m_fragment_shader_id_for_multiple_invocations_pass, 1, &m_fragment_shader_code,
							  m_geometry_shader_id_for_multiple_invocations_pass,
							  n_geometry_shader_parts_for_multiple_invocations_pass,
							  m_geometry_shader_parts_for_multiple_invocations_pass,
							  m_vertex_shader_id_for_multiple_invocations_pass, 1, &m_vertex_shader_code))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}

	/* Build program for single GS invocations */
	if (false == buildProgram(m_program_object_id_for_single_invocation_pass,
							  m_fragment_shader_id_for_single_invocation_pass, 1, &m_fragment_shader_code,
							  m_geometry_shader_id_for_single_invocation_pass,
							  n_geometry_shader_parts_for_single_invocation_pass,
							  m_geometry_shader_parts_for_single_invocation_pass,
							  m_vertex_shader_id_for_single_invocation_pass, 1, &m_vertex_shader_code))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}

	/* Set up texture object and a FBO */
	gl.genTextures(1, &m_color_texture_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create texture object");

	gl.genFramebuffers(1, &m_framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer object");

	m_texture_width = m_triangle_edge_length * m_max_geometry_shader_invocations;

	if (false == setupFramebufferWithTextureAsAttachment(m_framebuffer_object_id, m_color_texture_id, GL_RGBA8,
														 m_texture_width, m_texture_height))
	{
		TCU_FAIL("Failed to setup framebuffer");
	}

	/* Set up a vertex array object */
	gl.genVertexArrays(1, &m_vertex_array_object_id);
	gl.bindVertexArray(m_vertex_array_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");
}